

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall
RTree::range_search_recursive
          (RTree *this,RTree_node *node,Polygon *query,
          vector<Polygon_*,_std::allocator<Polygon_*>_> *ans)

{
  bool bVar1;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  
  if (node != (RTree_node *)0x0) {
    if (node->is_leaf == false) {
      lVar3 = 0;
      for (lVar2 = 0; lVar2 < node->elements; lVar2 = lVar2 + 1) {
        bVar1 = Polygon::intersect_with_BB
                          (*(Polygon **)
                            ((long)&((node->data_internal_node).
                                     super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->region + lVar3),
                           query);
        if (bVar1) {
          range_search_recursive
                    (this,*(RTree_node **)
                           ((long)&((node->data_internal_node).
                                    super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->child + lVar3),query
                     ,ans);
        }
        lVar3 = lVar3 + 0x10;
      }
    }
    else {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < node->elements; lVar3 = lVar3 + 1) {
        bVar1 = Polygon::is_Within_of
                          (*(Polygon **)
                            ((long)&((node->data_leafs).
                                     super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                     super__Vector_impl_data._M_start)->region + lVar2),query);
        if (bVar1) {
          std::vector<Polygon_*,_std::allocator<Polygon_*>_>::push_back
                    (ans,(value_type *)
                         ((long)&((node->data_leafs).
                                  super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                  super__Vector_impl_data._M_start)->polygon + lVar2));
        }
        lVar2 = lVar2 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void RTree::range_search_recursive(RTree_node * node, Polygon & query, std::vector<Polygon *> & ans){
    if(node != nullptr){
        if(!node->is_leaf){
            for(int i = 0; i < node->elements;i++){
                if(node->data_internal_node[i].region->intersect_with_BB(query) ){
                    //ans.push_back(data_query_return(node->data_internal_node[i].region,node->get_level()));
                    range_search_recursive(node->data_internal_node[i].child,query,ans);
                }
            }
        }
        else{
            for(int i = 0; i < node->elements; i++){
                if(node->data_leafs[i].region->is_Within_of(query)){
                    ans.push_back(node->data_leafs[i].polygon);
                }
            }
        }
    }
}